

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_relaxng(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  FILE *pFVar8;
  xmlDocPtr pxVar9;
  undefined8 uVar10;
  size_t sVar11;
  xmlDocPtr pxVar12;
  xmlDocPtr pxVar13;
  int nr;
  int nr_00;
  int nr_01;
  int nr_02;
  int nr_03;
  int nr_04;
  int nr_05;
  int nr_06;
  int n_output;
  int iVar14;
  xmlDocPtr in_RSI;
  int test_ret;
  ulong uVar15;
  int test_ret_1;
  undefined8 *puVar16;
  bool bVar17;
  char *__s;
  int n_doc;
  int local_44;
  int local_40;
  int test_ret_3;
  int test_ret_2;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing relaxng : 14 of 24 functions ...");
  }
  iVar14 = 0;
  local_40 = 0;
  do {
    if (iVar14 == 2) {
      function_tests = function_tests + 1;
      iVar14 = 0;
      local_44 = 0;
      do {
        if (iVar14 == 2) {
          function_tests = function_tests + 1;
          iVar14 = 0;
          bVar17 = true;
          while (bVar17) {
            bVar17 = true;
            while (bVar17) {
              bVar17 = true;
LAB_0012cb02:
              if (bVar17) {
                bVar17 = true;
                while (bVar17) {
                  iVar1 = xmlMemBlocks();
                  bVar17 = false;
                  in_RSI = (xmlDocPtr)0x0;
                  xmlRelaxNGGetParserErrors(0,0,0);
                  call_tests = call_tests + 1;
                  xmlResetLastError();
                  iVar2 = xmlMemBlocks();
                  if (iVar1 == iVar2) goto LAB_0012cb02;
                  xmlMemBlocks();
                  bVar17 = false;
                  printf("Leak of %d blocks found in xmlRelaxNGGetParserErrors");
                  iVar14 = iVar14 + 1;
                  printf(" %d");
                  printf(" %d");
                  printf(" %d");
                  in_RSI = (xmlDocPtr)0x0;
                  printf(" %d");
                  putchar(10);
                }
                bVar17 = false;
                goto LAB_0012cb02;
              }
              bVar17 = false;
            }
            bVar17 = false;
          }
          function_tests = function_tests + 1;
          iVar1 = 0;
          bVar17 = true;
          do {
            if (!bVar17) {
              local_44 = local_44 + local_40;
              function_tests = function_tests + 1;
              iVar2 = xmlMemBlocks();
              xmlRelaxNGInitTypes();
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar3 = xmlMemBlocks();
              if (iVar2 != iVar3) {
                iVar4 = xmlMemBlocks();
                in_RSI = (xmlDocPtr)(ulong)(uint)(iVar4 - iVar2);
                printf("Leak of %d blocks found in xmlRelaxNGInitTypes");
                putchar(10);
              }
              test_ret_3 = (int)(iVar2 != iVar3);
              function_tests = function_tests + 1;
              test_ret_2 = 0;
              pxVar12 = (xmlDocPtr)0x0;
              while (iVar2 = (int)pxVar12, iVar2 != 4) {
                iVar3 = xmlMemBlocks();
                pxVar9 = gen_xmlDocPtr(iVar2,(int)in_RSI);
                uVar10 = xmlRelaxNGNewDocParserCtxt(pxVar9);
                xmlRelaxNGFreeParserCtxt(uVar10);
                call_tests = call_tests + 1;
                des_xmlDocPtr((int)pxVar9,in_RSI,nr);
                xmlResetLastError();
                iVar4 = xmlMemBlocks();
                if (iVar3 != iVar4) {
                  iVar4 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlRelaxNGNewDocParserCtxt",
                         (ulong)(uint)(iVar4 - iVar3));
                  test_ret_2 = test_ret_2 + 1;
                  printf(" %d");
                  putchar(10);
                  in_RSI = pxVar12;
                }
                pxVar12 = (xmlDocPtr)(ulong)(iVar2 + 1);
              }
              function_tests = function_tests + 1;
              local_40 = 0;
              uVar15 = 0;
              while (iVar2 = (int)uVar15, iVar2 != 4) {
                pxVar12 = (xmlDocPtr)0x0;
                while (iVar3 = (int)pxVar12, iVar3 != 4) {
                  iVar4 = xmlMemBlocks();
                  if (iVar2 == 0) {
                    bVar17 = false;
                    __s = "foo";
                  }
                  else if (iVar2 == 2) {
                    bVar17 = false;
                    __s = "test/ent2";
                  }
                  else if (iVar2 == 1) {
                    bVar17 = false;
                    __s = "<foo/>";
                  }
                  else {
                    bVar17 = true;
                    __s = (char *)0x0;
                  }
                  uVar5 = gen_int(iVar3,(int)in_RSI);
                  if ((bVar17) || (sVar11 = strlen(__s), (int)uVar5 <= (int)sVar11 + 1)) {
                    in_RSI = (xmlDocPtr)(ulong)uVar5;
                    xmlRelaxNGNewMemParserCtxt(__s);
                    xmlRelaxNGFreeParserCtxt();
                    call_tests = call_tests + 1;
                    xmlResetLastError();
                    iVar6 = xmlMemBlocks();
                    if (iVar4 != iVar6) {
                      iVar6 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlRelaxNGNewMemParserCtxt",
                             (ulong)(uint)(iVar6 - iVar4));
                      local_40 = local_40 + 1;
                      printf(" %d",uVar15);
                      printf(" %d");
                      putchar(10);
                      in_RSI = pxVar12;
                    }
                  }
                  pxVar12 = (xmlDocPtr)(ulong)(iVar3 + 1);
                }
                uVar15 = (ulong)(iVar2 + 1);
              }
              function_tests = function_tests + 1;
              iVar14 = local_44 + iVar14 + iVar1 + test_ret_3;
              puVar16 = &DAT_00163d70;
              local_34 = 0;
              for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
                iVar1 = xmlMemBlocks();
                if (uVar5 < 3) {
                  uVar10 = *puVar16;
                }
                else {
                  uVar10 = 0;
                }
                xmlRelaxNGNewParserCtxt(uVar10);
                xmlRelaxNGFreeParserCtxt();
                call_tests = call_tests + 1;
                xmlResetLastError();
                iVar2 = xmlMemBlocks();
                if (iVar1 != iVar2) {
                  iVar2 = xmlMemBlocks();
                  printf("Leak of %d blocks found in xmlRelaxNGNewParserCtxt",
                         (ulong)(uint)(iVar2 - iVar1));
                  local_34 = local_34 + 1;
                  in_RSI = (xmlDocPtr)(ulong)uVar5;
                  printf(" %d");
                  putchar(10);
                }
                puVar16 = puVar16 + 1;
              }
              function_tests = function_tests + 1;
              bVar17 = true;
              test_ret_3 = 0;
              while (bVar17) {
                for (uVar5 = 0; iVar1 = (int)in_RSI, uVar5 != 4; uVar5 = uVar5 + 1) {
                  iVar2 = xmlMemBlocks();
                  pxVar12 = gen_xmlDocPtr(uVar5,iVar1);
                  in_RSI = pxVar12;
                  xmlRelaxNGValidateDoc(0);
                  call_tests = call_tests + 1;
                  des_xmlDocPtr((int)pxVar12,in_RSI,nr_00);
                  xmlResetLastError();
                  iVar1 = xmlMemBlocks();
                  if (iVar2 != iVar1) {
                    iVar1 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlRelaxNGValidateDoc",
                           (ulong)(uint)(iVar1 - iVar2));
                    test_ret_3 = test_ret_3 + 1;
                    printf(" %d",0);
                    in_RSI = (xmlDocPtr)(ulong)uVar5;
                    printf(" %d");
                    putchar(10);
                  }
                }
                bVar17 = false;
              }
              iVar14 = iVar14 + test_ret_2 + local_40;
              function_tests = function_tests + 1;
              pxVar12 = (xmlDocPtr)0x1;
              local_40 = 0;
              while (pxVar12 != (xmlDocPtr)0x0) {
                uVar15 = 0;
                while( true ) {
                  pxVar12 = (xmlDocPtr)0x0;
                  iVar1 = (int)uVar15;
                  if (iVar1 == 4) break;
                  while( true ) {
                    iVar2 = (int)in_RSI;
                    iVar3 = (int)pxVar12;
                    if (iVar3 == 3) break;
                    iVar4 = xmlMemBlocks();
                    pxVar13 = gen_xmlDocPtr(iVar1,iVar2);
                    in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar3,iVar2);
                    pxVar9 = pxVar13;
                    xmlRelaxNGValidateFullElement(0,pxVar13,in_RSI);
                    call_tests = call_tests + 1;
                    des_xmlDocPtr((int)pxVar13,pxVar9,nr_01);
                    des_xmlNodePtr(iVar3,(xmlNodePtr)in_RSI,nr_02);
                    xmlResetLastError();
                    iVar2 = xmlMemBlocks();
                    if (iVar4 != iVar2) {
                      iVar2 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlRelaxNGValidateFullElement",
                             (ulong)(uint)(iVar2 - iVar4));
                      local_40 = local_40 + 1;
                      printf(" %d",0);
                      printf(" %d",uVar15);
                      printf(" %d");
                      putchar(10);
                      in_RSI = pxVar12;
                    }
                    pxVar12 = (xmlDocPtr)(ulong)(iVar3 + 1);
                  }
                  uVar15 = (ulong)(iVar1 + 1);
                }
              }
              function_tests = function_tests + 1;
              pxVar12 = (xmlDocPtr)0x1;
              test_ret_2 = 0;
              while (pxVar12 != (xmlDocPtr)0x0) {
                uVar15 = 0;
                while( true ) {
                  pxVar12 = (xmlDocPtr)0x0;
                  iVar1 = (int)uVar15;
                  if (iVar1 == 4) break;
                  while( true ) {
                    iVar2 = (int)in_RSI;
                    iVar3 = (int)pxVar12;
                    if (iVar3 == 3) break;
                    iVar4 = xmlMemBlocks();
                    pxVar13 = gen_xmlDocPtr(iVar1,iVar2);
                    in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar3,iVar2);
                    pxVar9 = pxVar13;
                    xmlRelaxNGValidatePopElement(0,pxVar13,in_RSI);
                    call_tests = call_tests + 1;
                    des_xmlDocPtr((int)pxVar13,pxVar9,nr_03);
                    des_xmlNodePtr(iVar3,(xmlNodePtr)in_RSI,nr_04);
                    xmlResetLastError();
                    iVar2 = xmlMemBlocks();
                    if (iVar4 != iVar2) {
                      iVar2 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlRelaxNGValidatePopElement",
                             (ulong)(uint)(iVar2 - iVar4));
                      test_ret_2 = test_ret_2 + 1;
                      printf(" %d",0);
                      printf(" %d",uVar15);
                      printf(" %d");
                      putchar(10);
                      in_RSI = pxVar12;
                    }
                    pxVar12 = (xmlDocPtr)(ulong)(iVar3 + 1);
                  }
                  uVar15 = (ulong)(iVar1 + 1);
                }
              }
              iVar14 = iVar14 + local_34 + test_ret_3;
              function_tests = function_tests + 1;
              pxVar12 = (xmlDocPtr)0x1;
              test_ret_3 = 0;
              while (pxVar12 != (xmlDocPtr)0x0) {
                uVar15 = 0;
                while( true ) {
                  pxVar12 = (xmlDocPtr)0x0;
                  iVar1 = (int)uVar15;
                  if (iVar1 == 5) break;
                  while (iVar2 = (int)pxVar12, iVar2 != 4) {
                    iVar3 = xmlMemBlocks();
                    pxVar9 = (xmlDocPtr)gen_const_xmlChar_ptr(iVar1,(int)in_RSI);
                    iVar4 = gen_int(iVar2,(int)in_RSI);
                    if ((pxVar9 == (xmlDocPtr)0x0) ||
                       (sVar11 = strlen((char *)pxVar9), iVar4 <= (int)sVar11 + 1)) {
                      xmlRelaxNGValidatePushCData(0,pxVar9,iVar4);
                      call_tests = call_tests + 1;
                      xmlResetLastError();
                      iVar4 = xmlMemBlocks();
                      in_RSI = pxVar9;
                      if (iVar3 != iVar4) {
                        iVar4 = xmlMemBlocks();
                        printf("Leak of %d blocks found in xmlRelaxNGValidatePushCData",
                               (ulong)(uint)(iVar4 - iVar3));
                        test_ret_3 = test_ret_3 + 1;
                        printf(" %d",0);
                        printf(" %d",uVar15);
                        printf(" %d");
                        putchar(10);
                        in_RSI = pxVar12;
                      }
                    }
                    pxVar12 = (xmlDocPtr)(ulong)(iVar2 + 1);
                  }
                  uVar15 = (ulong)(iVar1 + 1);
                }
              }
              iVar14 = iVar14 + local_40;
              function_tests = function_tests + 1;
              pxVar12 = (xmlDocPtr)0x1;
              local_40 = 0;
              while (pxVar12 != (xmlDocPtr)0x0) {
                uVar15 = 0;
                while( true ) {
                  pxVar12 = (xmlDocPtr)0x0;
                  iVar1 = (int)uVar15;
                  if (iVar1 == 4) break;
                  while( true ) {
                    iVar2 = (int)in_RSI;
                    iVar3 = (int)pxVar12;
                    if (iVar3 == 3) break;
                    iVar4 = xmlMemBlocks();
                    pxVar13 = gen_xmlDocPtr(iVar1,iVar2);
                    in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar3,iVar2);
                    pxVar9 = pxVar13;
                    xmlRelaxNGValidatePushElement(0,pxVar13,in_RSI);
                    call_tests = call_tests + 1;
                    des_xmlDocPtr((int)pxVar13,pxVar9,nr_05);
                    des_xmlNodePtr(iVar3,(xmlNodePtr)in_RSI,nr_06);
                    xmlResetLastError();
                    iVar2 = xmlMemBlocks();
                    if (iVar4 != iVar2) {
                      iVar2 = xmlMemBlocks();
                      printf("Leak of %d blocks found in xmlRelaxNGValidatePushElement",
                             (ulong)(uint)(iVar2 - iVar4));
                      local_40 = local_40 + 1;
                      printf(" %d",0);
                      printf(" %d",uVar15);
                      printf(" %d");
                      putchar(10);
                      in_RSI = pxVar12;
                    }
                    pxVar12 = (xmlDocPtr)(ulong)(iVar3 + 1);
                  }
                  uVar15 = (ulong)(iVar1 + 1);
                }
              }
              function_tests = function_tests + 1;
              bVar17 = true;
              iVar1 = 0;
              while (bVar17) {
                for (uVar5 = 0; iVar2 = (int)in_RSI, uVar5 != 4; uVar5 = uVar5 + 1) {
                  iVar3 = xmlMemBlocks();
                  uVar7 = gen_int(uVar5,iVar2);
                  in_RSI = (xmlDocPtr)(ulong)uVar7;
                  xmlRelaxParserSetFlag(0);
                  call_tests = call_tests + 1;
                  xmlResetLastError();
                  iVar2 = xmlMemBlocks();
                  if (iVar3 != iVar2) {
                    iVar2 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlRelaxParserSetFlag",
                           (ulong)(uint)(iVar2 - iVar3));
                    iVar1 = iVar1 + 1;
                    printf(" %d",0);
                    in_RSI = (xmlDocPtr)(ulong)uVar5;
                    printf(" %d");
                    putchar(10);
                  }
                }
                bVar17 = false;
              }
              function_tests = function_tests + 1;
              uVar5 = iVar14 + test_ret_2 + test_ret_3 + local_40 + iVar1;
              if (uVar5 != 0) {
                printf("Module relaxng: %d errors\n",(ulong)uVar5);
              }
              return uVar5;
            }
            bVar17 = true;
            while (bVar17) {
              bVar17 = true;
LAB_0012cbd2:
              if (bVar17) {
                bVar17 = true;
                while (bVar17) {
                  iVar2 = xmlMemBlocks();
                  bVar17 = false;
                  in_RSI = (xmlDocPtr)0x0;
                  xmlRelaxNGGetValidErrors(0,0,0,0);
                  call_tests = call_tests + 1;
                  xmlResetLastError();
                  iVar3 = xmlMemBlocks();
                  if (iVar2 == iVar3) goto LAB_0012cbd2;
                  xmlMemBlocks();
                  bVar17 = false;
                  printf("Leak of %d blocks found in xmlRelaxNGGetValidErrors");
                  iVar1 = iVar1 + 1;
                  printf(" %d");
                  printf(" %d");
                  printf(" %d");
                  in_RSI = (xmlDocPtr)0x0;
                  printf(" %d");
                  putchar(10);
                }
                bVar17 = false;
                goto LAB_0012cbd2;
              }
              bVar17 = false;
            }
            bVar17 = false;
          } while( true );
        }
        bVar17 = true;
        while (bVar17) {
          iVar1 = xmlMemBlocks();
          pFVar8 = (FILE *)gen_FILE_ptr(iVar14,(int)in_RSI);
          in_RSI = (xmlDocPtr)0x0;
          xmlRelaxNGDumpTree();
          call_tests = call_tests + 1;
          if (pFVar8 != (FILE *)0x0) {
            fclose(pFVar8);
          }
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 == iVar2) break;
          iVar2 = xmlMemBlocks();
          bVar17 = false;
          printf("Leak of %d blocks found in xmlRelaxNGDumpTree",(ulong)(uint)(iVar2 - iVar1));
          local_44 = local_44 + 1;
          printf(" %d");
          in_RSI = (xmlDocPtr)0x0;
          printf(" %d");
          putchar(10);
        }
        iVar14 = iVar14 + 1;
      } while( true );
    }
    bVar17 = true;
    while (bVar17) {
      iVar1 = xmlMemBlocks();
      pFVar8 = (FILE *)gen_FILE_ptr(iVar14,(int)in_RSI);
      in_RSI = (xmlDocPtr)0x0;
      xmlRelaxNGDump();
      call_tests = call_tests + 1;
      if (pFVar8 != (FILE *)0x0) {
        fclose(pFVar8);
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 == iVar2) break;
      iVar2 = xmlMemBlocks();
      bVar17 = false;
      printf("Leak of %d blocks found in xmlRelaxNGDump",(ulong)(uint)(iVar2 - iVar1));
      local_40 = local_40 + 1;
      printf(" %d");
      in_RSI = (xmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar14 = iVar14 + 1;
  } while( true );
}

Assistant:

static int
test_relaxng(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing relaxng : 14 of 24 functions ...\n");
    test_ret += test_xmlRelaxNGDump();
    test_ret += test_xmlRelaxNGDumpTree();
    test_ret += test_xmlRelaxNGGetParserErrors();
    test_ret += test_xmlRelaxNGGetValidErrors();
    test_ret += test_xmlRelaxNGInitTypes();
    test_ret += test_xmlRelaxNGNewDocParserCtxt();
    test_ret += test_xmlRelaxNGNewMemParserCtxt();
    test_ret += test_xmlRelaxNGNewParserCtxt();
    test_ret += test_xmlRelaxNGNewValidCtxt();
    test_ret += test_xmlRelaxNGParse();
    test_ret += test_xmlRelaxNGSetParserErrors();
    test_ret += test_xmlRelaxNGSetParserStructuredErrors();
    test_ret += test_xmlRelaxNGSetValidErrors();
    test_ret += test_xmlRelaxNGSetValidStructuredErrors();
    test_ret += test_xmlRelaxNGValidateDoc();
    test_ret += test_xmlRelaxNGValidateFullElement();
    test_ret += test_xmlRelaxNGValidatePopElement();
    test_ret += test_xmlRelaxNGValidatePushCData();
    test_ret += test_xmlRelaxNGValidatePushElement();
    test_ret += test_xmlRelaxParserSetFlag();

    if (test_ret != 0)
	printf("Module relaxng: %d errors\n", test_ret);
    return(test_ret);
}